

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

BasicImageIO * __thiscall gimage::ImageIO::getBasicImageIO(ImageIO *this,char *name,bool reading)

{
  bool bVar1;
  uint uVar2;
  reference ppBVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  byte in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  const_iterator it;
  vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_> *in_stack_ffffffffffffff38
  ;
  __normal_iterator<gimage::BasicImageIO_*const_*,_std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>_>
  *in_stack_ffffffffffffff40;
  allocator local_89;
  string *in_stack_ffffffffffffff78;
  IOException *in_stack_ffffffffffffff80;
  __normal_iterator<gimage::BasicImageIO_*const_*,_std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>_>
  local_20;
  byte local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_20._M_current =
       (BasicImageIO **)
       std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>::begin
                 (in_stack_ffffffffffffff38);
  while( true ) {
    std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>::end
              (in_stack_ffffffffffffff38);
    bVar1 = __gnu_cxx::operator<
                      (in_stack_ffffffffffffff40,
                       (__normal_iterator<gimage::BasicImageIO_*const_*,_std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff78,(char *)local_10,&local_89);
      std::operator+((char *)local_10,__rhs);
      std::operator+(local_10,(char *)__rhs);
      gutil::IOException::IOException(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      __cxa_throw(__rhs,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
    }
    ppBVar3 = __gnu_cxx::
              __normal_iterator<gimage::BasicImageIO_*const_*,_std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>_>
              ::operator*(&local_20);
    uVar2 = (*(*ppBVar3)->_vptr_BasicImageIO[3])(*ppBVar3,local_10,(ulong)(local_11 & 1));
    if ((uVar2 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<gimage::BasicImageIO_*const_*,_std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>_>
    ::operator++(&local_20);
  }
  ppBVar3 = __gnu_cxx::
            __normal_iterator<gimage::BasicImageIO_*const_*,_std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>_>
            ::operator*(&local_20);
  return *ppBVar3;
}

Assistant:

const BasicImageIO &ImageIO::getBasicImageIO(const char *name, bool reading) const
{
  for (std::vector<BasicImageIO *>::const_iterator it=list.begin(); it<list.end(); ++it)
  {
    if ((*it)->handlesFile(name, reading))
    {
      return **it;
    }
  }

  throw gutil::IOException("Unknown image type ("+std::string(name)+")");
}